

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmon.cpp
# Opt level: O0

monitored_value_map * __thiscall memmon::get_json_total_stats_abi_cxx11_(memmon *this)

{
  bool bVar1;
  iterator this_00;
  reference __k;
  _Base_ptr p_Var2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
  *this_01;
  long in_RSI;
  monitored_value_map *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>
  *value;
  iterator __end1;
  iterator __begin1;
  monitored_list *__range1;
  monitored_value_map *mem_max_stat_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
  *in_stack_ffffffffffffff88;
  _Self local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  memset(in_RDI,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
         *)0x35a550);
  local_20 = in_RSI + 0x58;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
       ::begin(in_stack_ffffffffffffff88);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
            ::end(in_stack_ffffffffffffff88);
  while (bVar1 = std::operator!=(&local_28,(_Self *)&stack0xffffffffffffffd0), bVar1) {
    __k = std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
          ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
                       *)0x35a59b);
    p_Var2 = (_Base_ptr)prmon::monitored_value::get_max_value(&__k->second);
    this_01 = (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                               *)this_00._M_node,&__k->first);
    this_01->_M_node = p_Var2;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
    ::operator++(this_01);
  }
  return in_RDI;
}

Assistant:

prmon::monitored_value_map const memmon::get_json_total_stats() {
  prmon::monitored_value_map mem_max_stat_map{};
  for (const auto& value : mem_stats) {
    mem_max_stat_map[value.first] = value.second.get_max_value();
  }
  return mem_max_stat_map;
}